

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerDifferentiationTest.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  Variable x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Variable local_f8;
  PowerExpression local_e0;
  double local_b8;
  Expression local_a0;
  int local_84;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  char *local_60;
  long local_58;
  char local_50 [16];
  char *local_40;
  long local_38;
  char local_30 [16];
  
  local_e0.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression = (_func_int **)0x0;
  local_f8._vptr_Variable = (_func_int **)&PTR_differentiate_0011d4e0;
  local_f8.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Kandinsky::VariableExpression,std::allocator<Kandinsky::VariableExpression>,double&>
            (&local_f8.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(VariableExpression **)&local_f8.m_variableExpressionPtr,
             (allocator<Kandinsky::VariableExpression> *)&local_118,(double *)&local_e0);
  (local_f8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  local_a0._vptr_Expression = (_func_int **)CONCAT44(local_a0._vptr_Expression._4_4_,5);
  Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>(&local_e0,&local_f8,(int *)&local_a0);
  Kandinsky::BaseExpression::differentiate
            ((Expression *)&local_118,(BaseExpression *)&local_e0,&local_f8);
  (*(code *)**(undefined8 **)local_118._M_string_length)();
  local_b8 = extraout_XMM0_Qa;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"x = 3; d(pow(x,5))/dx != 405","");
  if (0.0001 <= ABS(local_b8 + -405.0)) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_40,local_38);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    local_118._M_dataplus._M_p = (pointer)&PTR_variables_0011d508;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._M_allocated_capacity !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_118.field_2._M_allocated_capacity);
    }
    local_e0.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression =
         (_func_int **)&PTR___cxa_pure_virtual_0011d298;
    if (local_e0.super_BinaryExpression.m_arg2.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super_BinaryExpression.m_arg2.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_e0.super_BinaryExpression.m_arg1.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super_BinaryExpression.m_arg1.
                 super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_84 = 4;
    Kandinsky::pow<int,_Kandinsky::Variable,_nullptr>(&local_e0,&local_84,&local_f8);
    Kandinsky::BaseExpression::differentiate(&local_a0,(BaseExpression *)&local_e0,&local_f8);
    (**(local_a0.m_baseExpressionPtr.
        super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_BaseExpression)();
    local_b8 = extraout_XMM0_Qa_00;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_118,vsnprintf,0x148,"%f",0x40562e42fefa39ef);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x11805d);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_70 = *plVar3;
      lStack_68 = plVar1[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar3;
      local_80 = (long *)*plVar1;
    }
    local_78 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (0.0001 <= ABS(local_b8 + -88.722839111673)) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_80,local_78);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      local_a0._vptr_Expression = (_func_int **)&PTR_variables_0011d508;
      if (local_a0.m_baseExpressionPtr.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.m_baseExpressionPtr.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_e0.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression =
           (_func_int **)&PTR___cxa_pure_virtual_0011d298;
      if (local_e0.super_BinaryExpression.m_arg2.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.super_BinaryExpression.m_arg2.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e0.super_BinaryExpression.m_arg1.
          super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.super_BinaryExpression.m_arg1.
                   super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      (local_f8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_value = 0.0;
      local_a0._vptr_Expression = (_func_int **)CONCAT44(local_a0._vptr_Expression._4_4_,5);
      Kandinsky::pow<Kandinsky::Variable,_int,_nullptr>(&local_e0,&local_f8,(int *)&local_a0);
      Kandinsky::BaseExpression::differentiate
                ((Expression *)&local_118,(BaseExpression *)&local_e0,&local_f8);
      (*(code *)**(undefined8 **)local_118._M_string_length)();
      local_b8 = extraout_XMM0_Qa_01;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"x = 0; d(pow(x,5))/dx != 0","");
      if (ABS(local_b8) < 0.0001) {
        if (local_60 != local_50) {
          operator_delete(local_60);
        }
        local_118._M_dataplus._M_p = (pointer)&PTR_variables_0011d508;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._M_allocated_capacity
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_118.field_2._M_allocated_capacity);
        }
        local_e0.super_BinaryExpression.super_BaseExpression._vptr_BaseExpression =
             (_func_int **)&PTR___cxa_pure_virtual_0011d298;
        if (local_e0.super_BinaryExpression.m_arg2.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.super_BinaryExpression.m_arg2.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_e0.super_BinaryExpression.m_arg1.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.super_BinaryExpression.m_arg1.
                     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_f8._vptr_Variable = (_func_int **)&PTR_differentiate_0011d4e0;
        if (local_f8.m_variableExpressionPtr.
            super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.m_variableExpressionPtr.
                     super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        return 0;
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_60,local_58);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  exit(1);
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(std::abs((pow(x, 5)).differentiate(x).evaluate() - 405) < 1.e-4, "x = 3; d(pow(x,5))/dx != 405");
    assertOrExit(std::abs((pow(4, x)).differentiate(x).evaluate() - 64*std::log(4)) < 1.e-4, "x = 3; d(pow(4,x))/dx != " + std::to_string(64*std::log(4)));
    x.setValue(0);
    assertOrExit(std::abs((pow(x, 5)).differentiate(x).evaluate() - 0) < 1.e-4, "x = 0; d(pow(x,5))/dx != 0");
    return 0;
}